

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  char *__s;
  Offset OVar1;
  Result RVar2;
  size_t sVar3;
  Const local_90;
  char *pcStack_58;
  Location loc;
  
  loc.filename.size_._0_4_ = 0;
  loc.filename.size_._4_4_ = 0;
  loc.field_1.field_0.line = 0;
  pcStack_58 = (char *)0x0;
  loc.filename.data_._0_4_ = 0;
  loc.filename.data_._4_4_ = 0;
  __s = this->filename_;
  sVar3 = strlen(__s);
  loc.filename.data_._0_4_ = (undefined4)sVar3;
  loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
  OVar1 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
  loc.filename.size_._0_4_ = (undefined4)OVar1;
  loc.filename.size_._4_4_ = (undefined4)(OVar1 >> 0x20);
  pcStack_58 = __s;
  Const::Const(&local_90,value_bits.v._0_8_,value_bits.v._8_8_,&pcStack_58);
  loc.field_1._8_8_ = operator_new(0x78);
  *(undefined8 *)(loc.field_1._8_8_ + 8) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x10) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x18) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x20) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x24) = 0;
  *(undefined8 *)(loc.field_1._8_8_ + 0x2c) = 0;
  *(undefined4 *)(loc.field_1._8_8_ + 0x38) = 0xe;
  *(undefined ***)loc.field_1._8_8_ = &PTR__Expr_0155b9c8;
  *(char **)(loc.field_1._8_8_ + 0x40) = local_90.loc.filename.data_;
  *(size_type *)(loc.field_1._8_8_ + 0x48) = local_90.loc.filename.size_;
  ((anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 *)
  (loc.field_1._8_8_ + 0x50))->offset = (size_t)local_90.loc.field_1.field_1.offset;
  *(undefined8 *)(loc.field_1._8_8_ + 0x58) = local_90.loc.field_1._8_8_;
  *(undefined8 *)(loc.field_1._8_8_ + 0x60) = local_90._32_8_;
  *(uint64_t *)(loc.field_1._8_8_ + 0x68) = local_90.field_2.u64;
  *(undefined8 *)(loc.field_1._8_8_ + 0x70) = local_90.field_2._8_8_;
  RVar2 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                          ((long)&loc.field_1 + 8));
  if (loc.field_1._8_8_ != 0) {
    (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
  }
  return (Result)RVar2.enum_;
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      MakeUnique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}